

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void close_local_endpoint(connection *conn)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int keep_alive;
  mg_connection *c;
  connection *conn_local;
  
  iVar1 = should_keep_alive(&conn->mg_conn);
  bVar3 = false;
  if ((iVar1 != 0) && (bVar3 = true, conn->endpoint_type != EP_FILE)) {
    bVar3 = conn->endpoint_type == EP_USER;
  }
  switch(conn->endpoint_type) {
  case EP_FILE:
  case EP_PUT:
    close((conn->endpoint).fd);
    break;
  case EP_CGI:
  case EP_PROXY:
    if ((conn->endpoint).nc != (ns_connection *)0x0) {
      ((conn->endpoint).nc)->flags = ((conn->endpoint).nc)->flags | 0x10;
      ((conn->endpoint).nc)->user_data = (void *)0x0;
    }
    break;
  default:
  }
  if (((0 < (conn->mg_conn).status_code) && (conn->endpoint_type != EP_CLIENT)) &&
     ((conn->mg_conn).status_code != 400)) {
    log_access(conn,conn->server->config_options[1]);
  }
  iobuf_free(&conn->ns_conn->recv_iobuf);
  free(conn->request);
  free(conn->path_info);
  (conn->endpoint).nc = (ns_connection *)0x0;
  conn->path_info = (char *)0x0;
  conn->request = (char *)0x0;
  conn->endpoint_type = EP_NONE;
  conn->request_len = 0;
  conn->num_bytes_recv = 0;
  conn->cl = 0;
  conn->ns_conn->flags = conn->ns_conn->flags & 0xffcfffec;
  (conn->mg_conn).query_string = (char *)0x0;
  (conn->mg_conn).http_version = (char *)0x0;
  (conn->mg_conn).uri = (char *)0x0;
  (conn->mg_conn).request_method = (char *)0x0;
  (conn->mg_conn).content_len = 0;
  (conn->mg_conn).is_websocket = 0;
  (conn->mg_conn).status_code = 0;
  (conn->mg_conn).num_headers = 0;
  (conn->mg_conn).callback_param = (void *)0x0;
  (conn->mg_conn).connection_param = (void *)0x0;
  if (bVar3) {
    on_recv_data(conn);
  }
  else {
    uVar2 = 1;
    if ((conn->ns_conn->send_iobuf).len == 0) {
      uVar2 = 0x10;
    }
    conn->ns_conn->flags = uVar2 | conn->ns_conn->flags;
  }
  return;
}

Assistant:

static void close_local_endpoint(struct connection *conn) {
  struct mg_connection *c = &conn->mg_conn;
  // Must be done before free()
  int keep_alive = should_keep_alive(&conn->mg_conn) &&
    (conn->endpoint_type == EP_FILE || conn->endpoint_type == EP_USER);
  DBG(("%p %d %d %d", conn, conn->endpoint_type, keep_alive,
       conn->ns_conn->flags));

  switch (conn->endpoint_type) {
    case EP_PUT:
    case EP_FILE:
      close(conn->endpoint.fd);
      break;
    case EP_CGI:
    case EP_PROXY:
      if (conn->endpoint.nc != NULL) {
        DBG(("%p %p %p :-)", conn, conn->ns_conn, conn->endpoint.nc));
        conn->endpoint.nc->flags |= NSF_CLOSE_IMMEDIATELY;
        conn->endpoint.nc->user_data = NULL;
      }
      break;
    default: break;
  }

#ifndef MONGOOSE_NO_LOGGING
  if (c->status_code > 0 && conn->endpoint_type != EP_CLIENT &&
      c->status_code != 400) {
    log_access(conn, conn->server->config_options[ACCESS_LOG_FILE]);
  }
#endif

  // Gobble possible POST data sent to the URI handler
  iobuf_free(&conn->ns_conn->recv_iobuf);
  free(conn->request);
  free(conn->path_info);
  conn->endpoint.nc = NULL;
  conn->request = conn->path_info = NULL;

  conn->endpoint_type = EP_NONE;
  conn->cl = conn->num_bytes_recv = conn->request_len = 0;
  conn->ns_conn->flags &= ~(NSF_FINISHED_SENDING_DATA |
                            NSF_BUFFER_BUT_DONT_SEND | NSF_CLOSE_IMMEDIATELY |
                            MG_HEADERS_SENT | MG_LONG_RUNNING);

  // Do not memset() the whole structure, as some of the fields
  // (IP addresses & ports, server_param) must survive. Nullify the rest.
  c->request_method = c->uri = c->http_version = c->query_string = NULL;
  c->num_headers = c->status_code = c->is_websocket = c->content_len = 0;
  c->connection_param = c->callback_param = NULL;

  if (keep_alive) {
    on_recv_data(conn);  // Can call us recursively if pipelining is used
  } else {
    conn->ns_conn->flags |= conn->ns_conn->send_iobuf.len == 0 ?
      NSF_CLOSE_IMMEDIATELY : NSF_FINISHED_SENDING_DATA;
  }
}